

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O2

bool __thiscall
linq::
IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>::
iterator::operator!=(iterator *this,iterator *other)

{
  bool bVar1;
  iterator iStack_98;
  
  iterator(&iStack_98,other);
  bVar1 = this->valid;
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::~GroupByState
            (&iStack_98.source);
  return (bool)((iStack_98.valid | bVar1) & 1);
}

Assistant:

bool operator!=(iterator other) const { return !(*this == other); }